

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

BOOL __thiscall Js::GlobalObject::HasOwnProperty(GlobalObject *this,PropertyId propertyId)

{
  RecyclableObject *pRVar1;
  PropertyQueryFlags PVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = 0;
  PVar2 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,(PropertyValueInfo *)0x0)
  ;
  if (PVar2 == Property_Found) {
    uVar4 = 1;
  }
  else {
    pRVar1 = (this->directHostObject).ptr;
    if (pRVar1 != (RecyclableObject *)0x0) {
      iVar3 = (*(pRVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xb])(pRVar1,(ulong)(uint)propertyId,0);
      uVar4 = (uint)(iVar3 == 1);
    }
  }
  return uVar4;
}

Assistant:

BOOL GlobalObject::HasOwnProperty(PropertyId propertyId)
    {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, nullptr /*info*/)) ||
            (this->directHostObject && this->directHostObject->HasProperty(propertyId));
    }